

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_hc.cpp
# Opt level: O1

bool __thiscall
crnlib::dxt_hc::compress
          (dxt_hc *this,color_quad_u8 (*blocks) [16],
          vector<crnlib::dxt_hc::endpoint_indices_details> *endpoint_indices,
          vector<crnlib::dxt_hc::selector_indices_details> *selector_indices,
          vector<unsigned_int> *color_endpoints,vector<unsigned_int> *alpha_endpoints,
          vector<unsigned_int> *color_selectors,vector<unsigned_long_long> *alpha_selectors,
          params *p)

{
  float *pfVar1;
  short sVar2;
  tile_details *ptVar3;
  void *p_00;
  color_cluster *pcVar4;
  alpha_cluster *paVar5;
  uint *puVar6;
  unsigned_long_long *puVar7;
  undefined8 uVar8;
  vector<crnlib::dxt_hc::selector_indices_details> *this_00;
  uint8 uVar9;
  uint uVar10;
  crn_thread_id_t cVar11;
  long lVar12;
  executable_task *pObj;
  int iVar13;
  ulong uVar14;
  float (*pafVar15) [8];
  task_pool *this_01;
  bool bVar16;
  elemental_vector *peVar17;
  uint uVar18;
  uint uVar19;
  uint b;
  code *pcVar20;
  ulong uVar21;
  uint64 data;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  float fVar25;
  uint uVar26;
  uint uVar28;
  uint uVar29;
  undefined1 auVar27 [16];
  uint uVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  float fVar33;
  hash_map<unsigned_long_long,_unsigned_int,_crnlib::hasher<unsigned_long_long>,_crnlib::equal_to<unsigned_long_long>_>
  alpha_selectors_map;
  vector<unsigned_short> alpha_selectors_remap;
  vector<unsigned_short> color_selectors_remap;
  vector<unsigned_short> alpha_endpoints_remap;
  hash_map<unsigned_int,_unsigned_int,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
  color_selectors_map;
  hash_map<unsigned_int,_unsigned_int,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
  alpha_endpoints_map;
  vector<unsigned_short> color_endpoints_remap;
  insert_result insert_result_3;
  hash_map<unsigned_int,_unsigned_int,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
  color_endpoints_map;
  undefined1 local_168 [16];
  uint local_158;
  undefined8 local_150;
  elemental_vector local_148;
  elemental_vector local_138;
  elemental_vector local_128;
  vector<crnlib::dxt_hc::endpoint_indices_details> *local_110;
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  uint local_e8;
  undefined8 local_e0;
  uint local_d0;
  uint local_cc;
  undefined1 local_c8 [16];
  uint local_b8;
  undefined8 local_b0;
  elemental_vector local_a8;
  anon_struct_16_4_e4b8e16b *local_98;
  ulong local_90;
  vector<crnlib::dxt_hc::selector_indices_details> *local_88;
  insert_result local_80;
  hash_map<unsigned_int,_unsigned_int,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
  local_68;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  clear(this);
  bVar22 = (uint)(p->m_format + ~cDXN_YX) < 5;
  this->m_has_etc_color_blocks = bVar22;
  this->m_has_subblocks = (uint)(p->m_format + ~cDXN_YX) < 3;
  bVar16 = true;
  if ((p->m_format != cDXT1) && (p->m_format != cDXT5)) {
    bVar16 = bVar22;
  }
  this->m_has_color_blocks = bVar16;
  uVar26 = p->m_format + ~cDXT3;
  if ((uVar26 < 9) && ((0x147U >> (uVar26 & 0x1f) & 1) != 0)) {
    uVar10 = *(uint *)(&DAT_001babe0 + (ulong)uVar26 * 4);
  }
  else {
    uVar10 = (uint)(p->m_format == cDXN_YX) * 2;
  }
  this->m_num_alpha_blocks = uVar10;
  bVar16 = (bool)(uVar10 != 0 | bVar16);
  if (bVar16 == true) {
    this->m_blocks = blocks;
    local_88 = selector_indices;
    cVar11 = crn_get_current_thread_id();
    this->m_main_thread_id = cVar11;
    this->m_pTask_pool = p->m_pTask_pool;
    memcpy(&this->m_params,p,0x158);
    if (p->m_num_levels != 0) {
      pafVar15 = this->m_color_derating;
      uVar21 = 0;
      auVar31 = _DAT_001baa10;
      do {
        fVar33 = p->m_adaptive_tile_color_psnr_derating;
        if ((uVar21 != 0) && (0.25 < fVar33)) {
          local_108 = ZEXT416((uint)fVar33);
          fVar25 = powf(3.0,(float)(uVar21 & 0xffffffff));
          auVar31 = _DAT_001baa10;
          fVar33 = 0.25;
          if (0.25 <= (float)local_108._0_4_ / fVar25) {
            fVar33 = (float)local_108._0_4_ / fVar25;
          }
        }
        lVar12 = 0;
        do {
          auVar27._0_4_ =
               ((float)(*(uint *)((long)&DAT_001baae0 + lVar12) >> 0x10 | 0x53000000) - 5.497642e+11
               ) + (float)(*(uint *)((long)&DAT_001baae0 + lVar12) & 0xffff | 0x4b000000);
          auVar27._4_4_ =
               ((float)(*(uint *)((long)&DAT_001baae4 + lVar12) >> 0x10 | 0x53000000) - 5.497642e+11
               ) + (float)(*(uint *)((long)&DAT_001baae4 + lVar12) & 0xffff | 0x4b000000);
          auVar27._8_4_ =
               ((float)(*(uint *)(&UNK_001baae8 + lVar12) >> 0x10 | 0x53000000) - 5.497642e+11) +
               (float)(*(uint *)(&UNK_001baae8 + lVar12) & 0xffff | 0x4b000000);
          auVar27._12_4_ =
               ((float)(*(uint *)(&UNK_001baaec + lVar12) >> 0x10 | 0x53000000) - 5.497642e+11) +
               (float)(*(uint *)(&UNK_001baaec + lVar12) & 0xffff | 0x4b000000);
          auVar27 = divps(auVar27,auVar31);
          pfVar1 = (float *)((long)*pafVar15 + lVar12);
          *pfVar1 = auVar27._0_4_ * fVar33 + 0.0;
          pfVar1[1] = auVar27._4_4_ * fVar33 + 0.0;
          pfVar1[2] = auVar27._8_4_ * fVar33 + 0.0;
          pfVar1[3] = auVar27._12_4_ * fVar33 + 0.0;
          lVar12 = lVar12 + 0x10;
        } while (lVar12 != 0x20);
        uVar21 = uVar21 + 1;
        pafVar15 = pafVar15 + 1;
      } while (uVar21 < p->m_num_levels);
    }
    lVar12 = 0;
    do {
      *(float *)((long)this->m_alpha_derating + lVar12) =
           ((float)*(uint *)((long)&DAT_001baae0 + lVar12) / 3.0) *
           (this->m_params).m_adaptive_tile_alpha_psnr_derating + 0.0;
      auVar31 = _DAT_001baa20;
      lVar12 = lVar12 + 4;
    } while (lVar12 != 0x20);
    uVar26 = 0;
    uVar28 = 1;
    uVar29 = 2;
    uVar30 = 3;
    lVar12 = 0x8d;
    do {
      auVar32._0_4_ =
           ((float)(uVar26 >> 0x10 | 0x53000000) - 5.497642e+11) +
           (float)(uVar26 & 0xffff | 0x4b000000);
      auVar32._4_4_ =
           ((float)(uVar28 >> 0x10 | 0x53000000) - 5.497642e+11) +
           (float)(uVar28 & 0xffff | 0x4b000000);
      auVar32._8_4_ =
           ((float)(uVar29 >> 0x10 | 0x53000000) - 5.497642e+11) +
           (float)(uVar29 & 0xffff | 0x4b000000);
      auVar32._12_4_ =
           ((float)(uVar30 >> 0x10 | 0x53000000) - 5.497642e+11) +
           (float)(uVar30 & 0xffff | 0x4b000000);
      auVar27 = divps(auVar32,auVar31);
      *(undefined1 (*) [16])((long)(this->m_color_derating + -1) + 0xc + lVar12 * 4) = auVar27;
      uVar26 = uVar26 + 4;
      uVar28 = uVar28 + 4;
      uVar29 = uVar29 + 4;
      uVar30 = uVar30 + 4;
      lVar12 = lVar12 + 4;
    } while (lVar12 != 0x18d);
    uVar26 = (this->m_block_weights).m_size;
    uVar28 = (this->m_params).m_num_blocks;
    this->m_num_blocks = uVar28;
    if (uVar26 != uVar28) {
      if (uVar26 <= uVar28) {
        if ((this->m_block_weights).m_capacity < uVar28) {
          elemental_vector::increase_capacity
                    ((elemental_vector *)&this->m_block_weights,uVar28,uVar26 + 1 == uVar28,4,
                     (object_mover)0x0,false);
        }
        uVar26 = (this->m_block_weights).m_size;
        memset((this->m_block_weights).m_p + uVar26,0,(ulong)(uVar28 - uVar26) << 2);
      }
      (this->m_block_weights).m_size = uVar28;
    }
    uVar26 = this->m_num_blocks;
    uVar28 = (this->m_block_encodings).m_size;
    if (uVar28 != uVar26) {
      if (uVar28 <= uVar26) {
        if ((this->m_block_encodings).m_capacity < uVar26) {
          elemental_vector::increase_capacity
                    ((elemental_vector *)&this->m_block_encodings,uVar26,uVar28 + 1 == uVar26,1,
                     (object_mover)0x0,false);
        }
        uVar28 = (this->m_block_encodings).m_size;
        memset((this->m_block_encodings).m_p + uVar28,0,(ulong)(uVar26 - uVar28));
      }
      (this->m_block_encodings).m_size = uVar26;
    }
    local_108._0_8_ = endpoint_indices;
    lVar12 = 0x668;
    do {
      peVar17 = (elemental_vector *)((long)(this->m_color_derating + -1) + 0xc + lVar12);
      uVar26 = this->m_num_blocks;
      uVar28 = *(uint *)((long)(this->m_color_derating + -1) + 0x14 + lVar12);
      if (uVar28 != uVar26) {
        if (uVar28 <= uVar26) {
          if (*(uint *)((long)(this->m_color_derating + -1) + 0x18 + lVar12) < uVar26) {
            elemental_vector::increase_capacity
                      (peVar17,uVar26,uVar28 + 1 == uVar26,8,(object_mover)0x0,false);
          }
          memset((void *)((ulong)peVar17->m_size * 8 + (long)peVar17->m_p),0,
                 (ulong)(uVar26 - peVar17->m_size) << 3);
        }
        peVar17->m_size = uVar26;
      }
      lVar12 = lVar12 + 0x10;
    } while (lVar12 != 0x698);
    uVar26 = this->m_num_blocks;
    uVar28 = (this->m_tile_indices).m_size;
    if (uVar28 != uVar26) {
      if (uVar28 <= uVar26) {
        if ((this->m_tile_indices).m_capacity < uVar26) {
          elemental_vector::increase_capacity
                    ((elemental_vector *)&this->m_tile_indices,uVar26,uVar28 + 1 == uVar26,4,
                     (object_mover)0x0,false);
        }
        uVar28 = (this->m_tile_indices).m_size;
        memset((this->m_tile_indices).m_p + uVar28,0,(ulong)(uVar26 - uVar28) << 2);
      }
      (this->m_tile_indices).m_size = uVar26;
    }
    local_110 = &this->m_endpoint_indices;
    uVar26 = this->m_num_blocks;
    uVar28 = (this->m_endpoint_indices).m_size;
    if (uVar28 != uVar26) {
      if (uVar28 <= uVar26) {
        if ((this->m_endpoint_indices).m_capacity < uVar26) {
          elemental_vector::increase_capacity
                    ((elemental_vector *)local_110,uVar26,uVar28 + 1 == uVar26,8,
                     vector<crnlib::dxt_hc::endpoint_indices_details>::object_mover,false);
        }
        uVar28 = (this->m_endpoint_indices).m_size;
        if (uVar26 != uVar28) {
          memset(local_110->m_p + uVar28,0,(ulong)(uVar26 - uVar28) << 3);
        }
      }
      (this->m_endpoint_indices).m_size = uVar26;
    }
    uVar26 = this->m_num_blocks;
    uVar28 = (this->m_selector_indices).m_size;
    if (uVar28 != uVar26) {
      if (uVar28 <= uVar26) {
        if ((this->m_selector_indices).m_capacity < uVar26) {
          elemental_vector::increase_capacity
                    ((elemental_vector *)&this->m_selector_indices,uVar26,uVar28 + 1 == uVar26,6,
                     vector<crnlib::dxt_hc::selector_indices_details>::object_mover,false);
        }
        uVar28 = (this->m_selector_indices).m_size;
        if (uVar26 != uVar28) {
          memset((this->m_selector_indices).m_p + uVar28,0,
                 (((ulong)(uVar26 - uVar28) * 6 - 6) / 6) * 6 + 6);
        }
      }
      (this->m_selector_indices).m_size = uVar26;
    }
    uVar26 = this->m_num_blocks;
    uVar28 = (this->m_tiles).m_size;
    uVar29 = uVar28 - uVar26;
    if (uVar29 != 0) {
      if (uVar28 < uVar26 || uVar29 == 0) {
        if ((this->m_tiles).m_capacity < uVar26) {
          elemental_vector::increase_capacity
                    ((elemental_vector *)this,uVar26,uVar28 + 1 == uVar26,0x48,
                     vector<crnlib::dxt_hc::tile_details>::object_mover,false);
        }
        uVar28 = (this->m_tiles).m_size;
        uVar29 = uVar26 - uVar28;
        if (uVar29 != 0) {
          ptVar3 = (this->m_tiles).m_p;
          lVar12 = 0;
          do {
            *(undefined1 (*) [16])((long)ptVar3[uVar28].color_endpoint.m_s + lVar12 + -0x14) =
                 (undefined1  [16])0x0;
            lVar12 = lVar12 + 0x48;
          } while ((ulong)uVar29 * 0x48 != lVar12);
        }
      }
      else {
        ptVar3 = (this->m_tiles).m_p;
        lVar12 = 0;
        do {
          p_00 = *(void **)((long)ptVar3[uVar26].color_endpoint.m_s + lVar12 + -0x14);
          if (p_00 != (void *)0x0) {
            crnlib_free(p_00);
          }
          lVar12 = lVar12 + 0x48;
        } while ((ulong)uVar29 * 0x48 != lVar12);
      }
      (this->m_tiles).m_size = uVar26;
    }
    if (p->m_num_levels != 0) {
      uVar21 = 0;
      do {
        uVar26 = p->m_levels[uVar21].m_first_block;
        uVar14 = (ulong)uVar26;
        uVar28 = p->m_levels[uVar21].m_num_blocks + uVar26;
        if (uVar26 < uVar28) {
          fVar33 = p->m_levels[uVar21].m_weight;
          do {
            (this->m_block_weights).m_p[uVar14] = fVar33;
            uVar14 = uVar14 + 1;
          } while (uVar28 != uVar14);
        }
        uVar21 = uVar21 + 1;
      } while (uVar21 < p->m_num_levels);
    }
    this_01 = this->m_pTask_pool;
    data = 0;
    do {
      pcVar20 = determine_tiles_task;
      if (this->m_has_subblocks != false) {
        pcVar20 = determine_tiles_task_etc;
      }
      pObj = (executable_task *)crnlib_malloc(0x28);
      pObj->_vptr_executable_task = (_func_int **)&PTR_execute_task_001de950;
      pObj[1]._vptr_executable_task = (_func_int **)this;
      pObj[2]._vptr_executable_task = (_func_int **)pcVar20;
      pObj[3]._vptr_executable_task = (_func_int **)0x0;
      *(undefined4 *)&pObj[4]._vptr_executable_task = 1;
      task_pool::queue_task(this_01,pObj,data,(void *)0x0);
      uVar26 = (int)data + 1;
      data = (uint64)uVar26;
      this_01 = this->m_pTask_pool;
    } while (uVar26 <= this_01->m_num_threads);
    task_pool::join(this_01);
    this->m_num_tiles = 0;
    uVar21 = (ulong)(this->m_tiles).m_size;
    if (uVar21 != 0) {
      uVar10 = this->m_num_tiles;
      ptVar3 = (this->m_tiles).m_p;
      lVar12 = 0;
      do {
        if (*(int *)((long)(ptVar3->color_endpoint).m_s + lVar12 + -0xc) != 0) {
          uVar10 = uVar10 + 1;
          this->m_num_tiles = uVar10;
        }
        lVar12 = lVar12 + 0x48;
      } while (uVar21 * 0x48 != lVar12);
    }
    if (this->m_has_color_blocks != false) {
      determine_color_endpoints(this);
    }
    if (this->m_num_alpha_blocks != 0) {
      determine_alpha_endpoints(this);
    }
    if (this->m_has_color_blocks == true) {
      create_color_selector_codebook(this);
    }
    if (this->m_num_alpha_blocks != 0) {
      create_alpha_selector_codebook(this);
    }
    vector<unsigned_int>::reserve
              (color_endpoints,(this->m_color_clusters).m_size + color_endpoints->m_size);
    uVar10 = (this->m_color_clusters).m_size;
    local_a8.m_p = (void *)0x0;
    local_a8.m_size = 0;
    local_a8.m_capacity = 0;
    if (uVar10 != 0) {
      elemental_vector::increase_capacity(&local_a8,uVar10,uVar10 == 1,2,(object_mover)0x0,false);
      memset((void *)((ulong)local_a8.m_size * 2 + (long)local_a8.m_p),0,
             (ulong)(uVar10 - local_a8.m_size) * 2);
      local_a8.m_size = uVar10;
    }
    local_68.m_values.m_p = (raw_node *)0x0;
    local_68.m_values.m_size = 0;
    local_68.m_values.m_capacity = 0;
    local_68.m_hash_shift = 0x20;
    local_68.m_num_valid = 0;
    local_68.m_grow_threshold = 0;
    if ((this->m_color_clusters).m_size != 0) {
      lVar12 = 0x22;
      uVar21 = 0;
      do {
        pcVar4 = (this->m_color_clusters).m_p;
        if (*(int *)((long)pcVar4->blocks + lVar12 * 2 + -0xc) != 0) {
          uVar10 = *(uint *)((long)pcVar4->blocks + lVar12 * 2 + -4);
          if (this->m_has_etc_color_blocks == false) {
            uVar10 = dxt1_block::pack_endpoints
                               (uVar10,*(uint *)((long)&pcVar4->blocks[0].m_p + lVar12 * 2));
          }
          local_f8._0_4_ = uVar10;
          local_168._0_4_ = color_endpoints->m_size;
          hash_map<unsigned_int,_unsigned_int,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
          ::insert((insert_result *)local_c8,&local_68,(uint *)local_f8,(uint *)local_168);
          if (local_b8._0_1_ == true) {
            *(short *)((long)local_a8.m_p + uVar21 * 2) = (short)color_endpoints->m_size;
            if (color_endpoints->m_capacity <= color_endpoints->m_size) {
              elemental_vector::increase_capacity
                        ((elemental_vector *)color_endpoints,color_endpoints->m_size + 1,true,4,
                         (object_mover)0x0,false);
            }
            color_endpoints->m_p[color_endpoints->m_size] = local_f8._0_4_;
            color_endpoints->m_size = color_endpoints->m_size + 1;
          }
          else {
            *(undefined2 *)((long)local_a8.m_p + uVar21 * 2) =
                 *(undefined2 *)
                  (((node_vector *)local_c8._0_8_)->m_p[(uint)local_c8._8_4_].m_bits + 4);
          }
        }
        uVar21 = uVar21 + 1;
        lVar12 = lVar12 + 0x2c;
      } while (uVar21 < (this->m_color_clusters).m_size);
    }
    vector<unsigned_int>::reserve
              (alpha_endpoints,(this->m_alpha_clusters).m_size + alpha_endpoints->m_size);
    uVar10 = (this->m_alpha_clusters).m_size;
    local_128.m_p = (void *)0x0;
    local_128.m_size = 0;
    local_128.m_capacity = 0;
    if (uVar10 != 0) {
      elemental_vector::increase_capacity(&local_128,uVar10,uVar10 == 1,2,(object_mover)0x0,false);
      memset((void *)((ulong)local_128.m_size * 2 + (long)local_128.m_p),0,
             (ulong)(uVar10 - local_128.m_size) * 2);
      local_128.m_size = uVar10;
    }
    local_c8._0_8_ = (raw_node *)0x0;
    local_c8._8_4_ = 0;
    local_c8._12_4_ = 0;
    local_b8 = 0x20;
    local_b0._0_4_ = 0;
    local_b0._4_4_ = 0;
    if ((this->m_alpha_clusters).m_size != 0) {
      lVar12 = 0x22;
      uVar21 = 0;
      do {
        paVar5 = (this->m_alpha_clusters).m_p;
        if (*(int *)((long)paVar5->blocks + lVar12 * 2 + -0xc) != 0) {
          uVar10 = dxt5_block::pack_endpoints
                             (*(uint *)((long)paVar5->blocks + lVar12 * 2 + -4),
                              *(uint *)((long)&paVar5->blocks[0].m_p + lVar12 * 2));
          local_168._0_4_ = uVar10;
          local_80.first.m_pTable._0_4_ = alpha_endpoints->m_size;
          hash_map<unsigned_int,_unsigned_int,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
          ::insert((insert_result *)local_f8,
                   (hash_map<unsigned_int,_unsigned_int,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
                    *)local_c8,(uint *)local_168,(uint *)&local_80);
          if (local_e8._0_1_ == true) {
            *(short *)((long)local_128.m_p + uVar21 * 2) = (short)alpha_endpoints->m_size;
            if (alpha_endpoints->m_capacity <= alpha_endpoints->m_size) {
              elemental_vector::increase_capacity
                        ((elemental_vector *)alpha_endpoints,alpha_endpoints->m_size + 1,true,4,
                         (object_mover)0x0,false);
            }
            alpha_endpoints->m_p[alpha_endpoints->m_size] = local_168._0_4_;
            alpha_endpoints->m_size = alpha_endpoints->m_size + 1;
          }
          else {
            *(undefined2 *)((long)local_128.m_p + uVar21 * 2) =
                 *(undefined2 *)
                  (((node_vector *)local_f8._0_8_)->m_p[(uint)local_f8._8_4_].m_bits + 4);
          }
        }
        uVar21 = uVar21 + 1;
        lVar12 = lVar12 + 0x48;
      } while (uVar21 < (this->m_alpha_clusters).m_size);
    }
    vector<unsigned_int>::reserve
              (color_selectors,(this->m_color_selectors).m_size + color_selectors->m_size);
    uVar10 = (this->m_color_selectors).m_size;
    local_138.m_p = (void *)0x0;
    local_138.m_size = 0;
    local_138.m_capacity = 0;
    if (uVar10 != 0) {
      elemental_vector::increase_capacity(&local_138,uVar10,uVar10 == 1,2,(object_mover)0x0,false);
      memset((void *)((ulong)local_138.m_size * 2 + (long)local_138.m_p),0,
             (ulong)(uVar10 - local_138.m_size) * 2);
      local_138.m_size = uVar10;
    }
    local_f8._0_8_ = (raw_node *)0x0;
    local_f8._8_4_ = 0;
    local_f8._12_4_ = 0;
    local_e8 = 0x20;
    local_e0._0_4_ = 0;
    local_e0._4_4_ = 0;
    if ((this->m_color_selectors).m_size != 0) {
      uVar21 = 0;
      do {
        if ((this->m_color_selectors_used).m_p[uVar21] == true) {
          local_80.first.m_pTable._0_4_ = color_selectors->m_size;
          hash_map<unsigned_int,_unsigned_int,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
          ::insert((insert_result *)local_168,
                   (hash_map<unsigned_int,_unsigned_int,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
                    *)local_f8,(this->m_color_selectors).m_p + uVar21,(uint *)&local_80);
          if (local_158._0_1_ == true) {
            *(short *)((long)local_138.m_p + uVar21 * 2) = (short)color_selectors->m_size;
            puVar6 = (this->m_color_selectors).m_p;
            if (color_selectors->m_capacity <= color_selectors->m_size) {
              elemental_vector::increase_capacity
                        ((elemental_vector *)color_selectors,color_selectors->m_size + 1,true,4,
                         (object_mover)0x0,false);
            }
            color_selectors->m_p[color_selectors->m_size] = puVar6[uVar21];
            color_selectors->m_size = color_selectors->m_size + 1;
          }
          else {
            *(undefined2 *)((long)local_138.m_p + uVar21 * 2) =
                 *(undefined2 *)
                  (((node_vector *)local_168._0_8_)->m_p[(uint)local_168._8_4_].m_bits + 4);
          }
        }
        uVar21 = uVar21 + 1;
      } while (uVar21 < (this->m_color_selectors).m_size);
    }
    vector<unsigned_long_long>::reserve
              (alpha_selectors,(this->m_alpha_selectors).m_size + alpha_selectors->m_size);
    uVar10 = (this->m_alpha_selectors).m_size;
    local_148.m_p = (void *)0x0;
    local_148.m_size = 0;
    local_148.m_capacity = 0;
    if (uVar10 != 0) {
      elemental_vector::increase_capacity(&local_148,uVar10,uVar10 == 1,2,(object_mover)0x0,false);
      memset((void *)((ulong)local_148.m_size * 2 + (long)local_148.m_p),0,
             (ulong)(uVar10 - local_148.m_size) * 2);
      local_148.m_size = uVar10;
    }
    local_168._0_8_ = (raw_node *)0x0;
    local_168._8_4_ = 0;
    local_168._12_4_ = 0;
    local_158 = 0x20;
    local_150._0_4_ = 0;
    local_150._4_4_ = 0;
    if ((this->m_alpha_selectors).m_size != 0) {
      uVar21 = 0;
      do {
        if ((this->m_alpha_selectors_used).m_p[uVar21] == true) {
          local_cc = alpha_selectors->m_size;
          hash_map<unsigned_long_long,_unsigned_int,_crnlib::hasher<unsigned_long_long>,_crnlib::equal_to<unsigned_long_long>_>
          ::insert(&local_80,
                   (hash_map<unsigned_long_long,_unsigned_int,_crnlib::hasher<unsigned_long_long>,_crnlib::equal_to<unsigned_long_long>_>
                    *)local_168,(this->m_alpha_selectors).m_p + uVar21,&local_cc);
          if (local_80.second == true) {
            *(short *)((long)local_148.m_p + uVar21 * 2) = (short)alpha_selectors->m_size;
            puVar7 = (this->m_alpha_selectors).m_p;
            if (alpha_selectors->m_capacity <= alpha_selectors->m_size) {
              elemental_vector::increase_capacity
                        ((elemental_vector *)alpha_selectors,alpha_selectors->m_size + 1,true,8,
                         (object_mover)0x0,false);
            }
            alpha_selectors->m_p[alpha_selectors->m_size] = puVar7[uVar21];
            alpha_selectors->m_size = alpha_selectors->m_size + 1;
          }
          else {
            *(undefined2 *)((long)local_148.m_p + uVar21 * 2) =
                 *(undefined2 *)
                  (*(long *)CONCAT44(local_80.first.m_pTable._4_4_,(uint)local_80.first.m_pTable) +
                   8 + (ulong)local_80.first.m_index * 0x10);
          }
        }
        uVar21 = uVar21 + 1;
      } while (uVar21 < (this->m_alpha_selectors).m_size);
    }
    this_00 = local_88;
    uVar26 = this->m_num_blocks;
    uVar8 = local_108._0_8_;
    uVar28 = *(uint *)(local_108._0_8_ + 8);
    if (uVar28 != uVar26) {
      if (uVar28 <= uVar26) {
        if (*(uint *)(local_108._0_8_ + 0xc) < uVar26) {
          elemental_vector::increase_capacity
                    ((elemental_vector *)local_108._0_8_,uVar26,uVar28 + 1 == uVar26,8,
                     vector<crnlib::dxt_hc::endpoint_indices_details>::object_mover,false);
        }
        uVar28 = *(uint *)(uVar8 + 8);
        if (uVar26 != uVar28) {
          memset((void *)((ulong)uVar28 * 8 + (long)*(void **)uVar8),0,(ulong)(uVar26 - uVar28) << 3
                );
        }
      }
      *(uint *)(uVar8 + 8) = uVar26;
    }
    uVar26 = this->m_num_blocks;
    uVar28 = this_00->m_size;
    if (uVar28 != uVar26) {
      if (uVar28 <= uVar26) {
        if (this_00->m_capacity < uVar26) {
          elemental_vector::increase_capacity
                    ((elemental_vector *)this_00,uVar26,uVar28 + 1 == uVar26,6,
                     vector<crnlib::dxt_hc::selector_indices_details>::object_mover,false);
        }
        uVar28 = this_00->m_size;
        if (uVar26 != uVar28) {
          memset(this_00->m_p + uVar28,0,(((ulong)(uVar26 - uVar28) * 6 - 6) / 6) * 6 + 6);
        }
      }
      this_00->m_size = uVar26;
    }
    if (p->m_num_levels != 0) {
      local_98 = p->m_levels;
      uVar21 = 0;
      do {
        local_48 = uVar21;
        uVar26 = local_98[local_48].m_first_block;
        local_d0 = p->m_levels[local_48].m_num_blocks + uVar26;
        if (uVar26 < local_d0) {
          uVar28 = p->m_levels[local_48].m_block_width;
          local_38 = (ulong)-uVar28;
          local_40 = (ulong)~uVar28;
          iVar13 = 0;
          do {
            if (uVar28 != 0) {
              uVar30 = uVar26 - 1;
              uVar18 = -uVar28 + uVar26;
              uVar19 = ~uVar28 + uVar26;
              uVar29 = 0;
              do {
                bVar22 = uVar29 != 0 || iVar13 != 0;
                bVar24 = this->m_has_subblocks == true && (uVar29 != 0 && iVar13 != 0);
                local_90 = (ulong)uVar26;
                uVar21 = (ulong)this->m_has_color_blocks ^ 1;
                bVar23 = iVar13 != 0;
                if ((uint)uVar21 < this->m_num_alpha_blocks + 1) {
                  do {
                    peVar17 = &local_128;
                    if (uVar21 == 0) {
                      peVar17 = &local_a8;
                    }
                    sVar2 = *(short *)((long)peVar17->m_p +
                                      (ulong)local_110->m_p[local_90].field_0.component[uVar21] * 2)
                    ;
                    if (bVar22) {
                      bVar22 = sVar2 == *(short *)(*(long *)local_108._0_8_ + (ulong)uVar30 * 8 +
                                                  uVar21 * 2);
                    }
                    else {
                      bVar22 = false;
                    }
                    if (bVar23) {
                      bVar23 = sVar2 == *(short *)(*(long *)local_108._0_8_ + (ulong)uVar18 * 8 +
                                                  uVar21 * 2);
                    }
                    else {
                      bVar23 = false;
                    }
                    if (bVar24) {
                      bVar24 = sVar2 == *(short *)(*(long *)local_108._0_8_ + (ulong)uVar19 * 8 +
                                                  uVar21 * 2);
                    }
                    else {
                      bVar24 = false;
                    }
                    *(short *)(*(long *)local_108._0_8_ + local_90 * 8 + uVar21 * 2) = sVar2;
                    peVar17 = &local_148;
                    if (uVar21 == 0) {
                      peVar17 = &local_138;
                    }
                    local_88->m_p[local_90].field_0.component[uVar21] =
                         *(uint16 *)
                          ((long)peVar17->m_p +
                          (ulong)(this->m_selector_indices).m_p[local_90].field_0.component[uVar21]
                          * 2);
                    uVar21 = uVar21 + 1;
                  } while (uVar21 < this->m_num_alpha_blocks + 1);
                }
                if ((this->m_has_subblocks == true) && ((uVar26 & 1) != 0)) {
                  uVar9 = local_110->m_p[local_90].reference;
                }
                else {
                  uVar9 = '\x01';
                  if ((!bVar22) && (uVar9 = bVar24 * '\x03', bVar23)) {
                    uVar9 = '\x02';
                  }
                }
                *(uint8 *)(*(long *)local_108._0_8_ + 6 + local_90 * 8) = uVar9;
                uVar29 = uVar29 + 1;
                uVar26 = uVar26 + 1;
                uVar30 = uVar30 + 1;
                uVar18 = uVar18 + 1;
                uVar19 = uVar19 + 1;
              } while (uVar29 != uVar28);
            }
            iVar13 = iVar13 + 1;
          } while (uVar26 < local_d0);
        }
        uVar21 = local_48 + 1;
      } while (local_48 + 1 < (ulong)p->m_num_levels);
    }
    this->m_pTask_pool = (task_pool *)0x0;
    if (local_168._8_4_ != 0) {
      if ((hash_map_type *)local_168._0_8_ != (hash_map_type *)0x0) {
        crnlib_free((void *)local_168._0_8_);
        local_168._0_8_ = (raw_node *)0x0;
        local_168._8_4_ = 0;
        local_168._12_4_ = 0;
      }
      local_158 = 0x20;
      local_150._0_4_ = 0;
      local_150._4_4_ = 0;
    }
    if ((hash_map_type *)local_168._0_8_ != (hash_map_type *)0x0) {
      crnlib_free((void *)local_168._0_8_);
    }
    if (local_148.m_p != (void *)0x0) {
      crnlib_free(local_148.m_p);
    }
    if (local_f8._8_4_ != 0) {
      if ((hash_map_type *)local_f8._0_8_ != (hash_map_type *)0x0) {
        crnlib_free((void *)local_f8._0_8_);
        local_f8._0_8_ = (raw_node *)0x0;
        local_f8._8_4_ = 0;
        local_f8._12_4_ = 0;
      }
      local_e8 = 0x20;
      local_e0._0_4_ = 0;
      local_e0._4_4_ = 0;
    }
    if ((hash_map_type *)local_f8._0_8_ != (hash_map_type *)0x0) {
      crnlib_free((void *)local_f8._0_8_);
    }
    if (local_138.m_p != (void *)0x0) {
      crnlib_free(local_138.m_p);
    }
    if (local_c8._8_4_ != 0) {
      if ((hash_map_type *)local_c8._0_8_ != (hash_map_type *)0x0) {
        crnlib_free((void *)local_c8._0_8_);
        local_c8._0_8_ = (raw_node *)0x0;
        local_c8._8_4_ = 0;
        local_c8._12_4_ = 0;
      }
      local_b8 = 0x20;
      local_b0._0_4_ = 0;
      local_b0._4_4_ = 0;
    }
    if ((hash_map_type *)local_c8._0_8_ != (hash_map_type *)0x0) {
      crnlib_free((void *)local_c8._0_8_);
    }
    if (local_128.m_p != (void *)0x0) {
      crnlib_free(local_128.m_p);
    }
    if (local_68.m_values.m_size != 0) {
      if (local_68.m_values.m_p != (raw_node *)0x0) {
        crnlib_free(local_68.m_values.m_p);
        local_68.m_values.m_p = (raw_node *)0x0;
        local_68.m_values.m_size = 0;
        local_68.m_values.m_capacity = 0;
      }
      local_68.m_hash_shift = 0x20;
      local_68.m_num_valid = 0;
      local_68.m_grow_threshold = 0;
    }
    if (local_68.m_values.m_p != (raw_node *)0x0) {
      crnlib_free(local_68.m_values.m_p);
    }
    if (local_a8.m_p != (void *)0x0) {
      crnlib_free(local_a8.m_p);
    }
  }
  return bVar16;
}

Assistant:

bool dxt_hc::compress(
    color_quad_u8 (*blocks)[16],
    crnlib::vector<endpoint_indices_details>& endpoint_indices,
    crnlib::vector<selector_indices_details>& selector_indices,
    crnlib::vector<uint32>& color_endpoints,
    crnlib::vector<uint32>& alpha_endpoints,
    crnlib::vector<uint32>& color_selectors,
    crnlib::vector<uint64>& alpha_selectors,
    const params& p
  ) {
  clear();
  m_has_etc_color_blocks = p.m_format == cETC1 || p.m_format == cETC2 || p.m_format == cETC2A || p.m_format == cETC1S || p.m_format == cETC2AS;
  m_has_subblocks = p.m_format == cETC1 || p.m_format == cETC2 || p.m_format == cETC2A;
  m_has_color_blocks = p.m_format == cDXT1 || p.m_format == cDXT5 || m_has_etc_color_blocks;
  m_num_alpha_blocks = p.m_format == cDXT5 || p.m_format == cDXT5A || p.m_format == cETC2A || p.m_format == cETC2AS ? 1 : p.m_format == cDXN_XY || p.m_format == cDXN_YX ? 2 : 0;
  if (!m_has_color_blocks && !m_num_alpha_blocks)
    return false;
  m_blocks = blocks;
  m_main_thread_id = crn_get_current_thread_id();
  m_pTask_pool = p.m_pTask_pool;
  m_params = p;

  uint tile_derating[8] = {0, 1, 1, 2, 2, 2, 2, 3};
  for (uint level = 0; level < p.m_num_levels; level++) {
    float adaptive_tile_color_psnr_derating = p.m_adaptive_tile_color_psnr_derating;
    if (level && adaptive_tile_color_psnr_derating > .25f)
      adaptive_tile_color_psnr_derating = math::maximum(.25f, adaptive_tile_color_psnr_derating / powf(3.0f, static_cast<float>(level)));
    for (uint e = 0; e < 8; e++)
      m_color_derating[level][e] = math::lerp(0.0f, adaptive_tile_color_psnr_derating, tile_derating[e] / 3.0f);
  }
  for (uint e = 0; e < 8; e++)
    m_alpha_derating[e] = math::lerp(0.0f, m_params.m_adaptive_tile_alpha_psnr_derating, tile_derating[e] / 3.0f);
  for (uint i = 0; i < 256; i++)
    m_uint8_to_float[i] = i * 1.0f / 255.0f;

  m_num_blocks = m_params.m_num_blocks;
  m_block_weights.resize(m_num_blocks);
  m_block_encodings.resize(m_num_blocks);
  for (uint c = 0; c < 3; c++)
    m_block_selectors[c].resize(m_num_blocks);
  m_tile_indices.resize(m_num_blocks);
  m_endpoint_indices.resize(m_num_blocks);
  m_selector_indices.resize(m_num_blocks);
  m_tiles.resize(m_num_blocks);

  for (uint level = 0; level < p.m_num_levels; level++) {
    float weight = p.m_levels[level].m_weight;
    for (uint b = p.m_levels[level].m_first_block, bEnd = b + p.m_levels[level].m_num_blocks; b < bEnd; b++)
      m_block_weights[b] = weight;
  }

  for (uint i = 0; i <= m_pTask_pool->get_num_threads(); i++)
    m_pTask_pool->queue_object_task(this, m_has_subblocks ? &dxt_hc::determine_tiles_task_etc : &dxt_hc::determine_tiles_task, i);
  m_pTask_pool->join();

  m_num_tiles = 0;
  for (uint t = 0; t < m_tiles.size(); t++) {
    if (m_tiles[t].pixels.size())
      m_num_tiles++;
  }

  if (m_has_color_blocks)
    determine_color_endpoints();

  if (m_num_alpha_blocks)
    determine_alpha_endpoints();

  if (m_has_color_blocks)
    create_color_selector_codebook();

  if (m_num_alpha_blocks)
    create_alpha_selector_codebook();

  color_endpoints.reserve(color_endpoints.size() + m_color_clusters.size());
  crnlib::vector<uint16> color_endpoints_remap(m_color_clusters.size());
  hash_map<uint32, uint> color_endpoints_map;
  for (uint i = 0; i < m_color_clusters.size(); i++) {
    if (m_color_clusters[i].pixels.size()) {
      uint32 endpoint = m_has_etc_color_blocks ? m_color_clusters[i].first_endpoint :
        dxt1_block::pack_endpoints(m_color_clusters[i].first_endpoint, m_color_clusters[i].second_endpoint);
      hash_map<uint32, uint>::insert_result insert_result = color_endpoints_map.insert(endpoint, color_endpoints.size());
      if (insert_result.second) {
        color_endpoints_remap[i] = color_endpoints.size();
        color_endpoints.push_back(endpoint);
      } else {
        color_endpoints_remap[i] = insert_result.first->second;
      }
    }
  }

  alpha_endpoints.reserve(alpha_endpoints.size() + m_alpha_clusters.size());
  crnlib::vector<uint16> alpha_endpoints_remap(m_alpha_clusters.size());
  hash_map<uint32, uint> alpha_endpoints_map;
  for (uint i = 0; i < m_alpha_clusters.size(); i++) {
    if (m_alpha_clusters[i].pixels.size()) {
      uint32 endpoint = dxt5_block::pack_endpoints(m_alpha_clusters[i].first_endpoint, m_alpha_clusters[i].second_endpoint);
      hash_map<uint32, uint>::insert_result insert_result = alpha_endpoints_map.insert(endpoint, alpha_endpoints.size());
      if (insert_result.second) {
        alpha_endpoints_remap[i] = alpha_endpoints.size();
        alpha_endpoints.push_back(endpoint);
      } else {
        alpha_endpoints_remap[i] = insert_result.first->second;
      }
    }
  }

  color_selectors.reserve(color_selectors.size() + m_color_selectors.size());
  crnlib::vector<uint16> color_selectors_remap(m_color_selectors.size());
  hash_map<uint32, uint> color_selectors_map;
  for (uint i = 0; i < m_color_selectors.size(); i++) {
    if (m_color_selectors_used[i]) {
      hash_map<uint32, uint>::insert_result insert_result = color_selectors_map.insert(m_color_selectors[i], color_selectors.size());
      if (insert_result.second) {
        color_selectors_remap[i] = color_selectors.size();
        color_selectors.push_back(m_color_selectors[i]);
      } else {
        color_selectors_remap[i] = insert_result.first->second;
      }
    }
  }

  alpha_selectors.reserve(alpha_selectors.size() + m_alpha_selectors.size());
  crnlib::vector<uint16> alpha_selectors_remap(m_alpha_selectors.size());
  hash_map<uint64, uint> alpha_selectors_map;
  for (uint i = 0; i < m_alpha_selectors.size(); i++) {
    if (m_alpha_selectors_used[i]) {
      hash_map<uint64, uint>::insert_result insert_result = alpha_selectors_map.insert(m_alpha_selectors[i], alpha_selectors.size());
      if (insert_result.second) {
        alpha_selectors_remap[i] = alpha_selectors.size();
        alpha_selectors.push_back(m_alpha_selectors[i]);
      } else {
        alpha_selectors_remap[i] = insert_result.first->second;
      }
    }
  }

  endpoint_indices.resize(m_num_blocks);
  selector_indices.resize(m_num_blocks);
  for (uint level = 0; level < p.m_num_levels; level++) {
    uint first_block = p.m_levels[level].m_first_block;
    uint end_block = first_block + p.m_levels[level].m_num_blocks;
    uint block_width = p.m_levels[level].m_block_width;
    for (uint by = 0, b = first_block; b < end_block; by++) {
      for (uint bx = 0; bx < block_width; bx++, b++) {
        bool top_match = by != 0;
        bool left_match = top_match || bx;
        bool diag_match = m_has_subblocks && top_match && bx;
        for (uint c = m_has_color_blocks ? 0 : cAlpha0; c < cAlpha0 + m_num_alpha_blocks; c++) {
          uint16 endpoint_index = (c ? alpha_endpoints_remap : color_endpoints_remap)[m_endpoint_indices[b].component[c]];
          left_match = left_match && endpoint_index == endpoint_indices[b - 1].component[c];
          top_match = top_match && endpoint_index == endpoint_indices[b - block_width].component[c];
          diag_match = diag_match && endpoint_index == endpoint_indices[b - block_width - 1].component[c];
          endpoint_indices[b].component[c] = endpoint_index;
          uint16 selector_index = (c ? alpha_selectors_remap : color_selectors_remap)[m_selector_indices[b].component[c]];
          selector_indices[b].component[c] = selector_index;
        }
        endpoint_indices[b].reference = m_has_subblocks && b & 1 ? m_endpoint_indices[b].reference : left_match ? 1 : top_match ? 2 : diag_match ? 3 : 0;
      }
    }
  }

  m_pTask_pool = NULL;
  return true;
}